

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O3

_Bool borg_happy_grid_bold(wchar_t y,wchar_t x)

{
  wchar_t y_00;
  uint8_t uVar1;
  _Bool _Var2;
  ulong uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  if ((uint)(x + L'\xffffff3c') < 0xffffff3f || (uint)(y + L'\xffffffc0') < 0xffffffc3) {
LAB_0021c87e:
    _Var2 = false;
  }
  else {
    uVar1 = borg_grids[y][x].feat;
    if ((1 < (byte)(uVar1 - 5)) && (borg_grids[y][x].glyph == false)) {
      if (((uVar1 == '\x17') && (borg.trait[0x40] == 0)) ||
         (((borg.trait[0x6c] != 0 || (borg.trait[0x1a] == 0)) || (1999 < borg_t - borg_began))))
      goto LAB_0021c87e;
      y_00 = y + L'\xffffffff';
      _Var2 = borg_cave_floor_bold(y_00,x);
      if (_Var2) {
        wVar6 = y + L'\x01';
        _Var2 = borg_cave_floor_bold(wVar6,x);
        if (_Var2) {
          wVar4 = x + L'\xffffffff';
          _Var2 = borg_cave_floor_bold(y,wVar4);
          if (!_Var2) {
            wVar5 = x + L'\x01';
            _Var2 = borg_cave_floor_bold(y,wVar5);
            if (((!_Var2) && (_Var2 = borg_cave_floor_bold(wVar6,wVar4), !_Var2)) &&
               ((_Var2 = borg_cave_floor_bold(wVar6,wVar5), !_Var2 &&
                ((_Var2 = borg_cave_floor_bold(y_00,wVar4), !_Var2 &&
                 (_Var2 = borg_cave_floor_bold(y_00,wVar5), !_Var2)))))) goto LAB_0021c8ab;
          }
        }
      }
      wVar6 = x + L'\xffffffff';
      _Var2 = borg_cave_floor_bold(y,wVar6);
      if (_Var2) {
        wVar4 = x + L'\x01';
        _Var2 = borg_cave_floor_bold(y,wVar4);
        if ((_Var2) && (_Var2 = borg_cave_floor_bold(y_00,x), !_Var2)) {
          wVar5 = y + L'\x01';
          _Var2 = borg_cave_floor_bold(wVar5,x);
          if ((!_Var2) &&
             ((((_Var2 = borg_cave_floor_bold(wVar5,wVar6), !_Var2 &&
                (_Var2 = borg_cave_floor_bold(wVar5,wVar4), !_Var2)) &&
               (_Var2 = borg_cave_floor_bold(y_00,wVar6), !_Var2)) &&
              (_Var2 = borg_cave_floor_bold(y_00,wVar4), !_Var2)))) goto LAB_0021c8ab;
        }
      }
      _Var2 = borg_cave_floor_bold(y_00,x);
      if (((((!_Var2) || (_Var2 = borg_cave_floor_bold(y + L'\x01',x), !_Var2)) ||
           (_Var2 = borg_cave_floor_bold(y,wVar6), _Var2)) ||
          (_Var2 = borg_cave_floor_bold(y,x + L'\x01'), _Var2)) &&
         ((((_Var2 = borg_cave_floor_bold(y,wVar6), !_Var2 ||
            (_Var2 = borg_cave_floor_bold(y,x + L'\x01'), !_Var2)) ||
           ((_Var2 = borg_cave_floor_bold(y_00,x), _Var2 ||
            (_Var2 = borg_cave_floor_bold(y + L'\x01',x), _Var2)))) &&
          ((((_Var2 = borg_cave_floor_bold(y_00,x), _Var2 ||
             (_Var2 = borg_cave_floor_bold(y_00,wVar6), !_Var2)) ||
            (_Var2 = borg_cave_floor_bold(y_00,x + L'\x01'), !_Var2)) ||
           (_Var2 = borg_cave_floor_bold(y + L'\xfffffffe',x), !_Var2)))))) {
        wVar4 = y + L'\x01';
        _Var2 = borg_cave_floor_bold(wVar4,x);
        if (((_Var2) || (_Var2 = borg_cave_floor_bold(wVar4,wVar6), !_Var2)) ||
           ((_Var2 = borg_cave_floor_bold(wVar4,x + L'\x01'), !_Var2 ||
            (_Var2 = borg_cave_floor_bold(y + L'\x02',x), !_Var2)))) {
          wVar5 = x + L'\x01';
          _Var2 = borg_cave_floor_bold(y,wVar5);
          if (((((_Var2) || (_Var2 = borg_cave_floor_bold(y_00,wVar5), !_Var2)) ||
               (_Var2 = borg_cave_floor_bold(wVar4,wVar5), !_Var2)) ||
              (_Var2 = borg_cave_floor_bold(y,x + L'\x02'), !_Var2)) &&
             ((((_Var2 = borg_cave_floor_bold(y,wVar6), _Var2 ||
                (_Var2 = borg_cave_floor_bold(y_00,wVar6), !_Var2)) ||
               (_Var2 = borg_cave_floor_bold(wVar4,wVar6), !_Var2)) ||
              (_Var2 = borg_cave_floor_bold(y,x + L'\xfffffffe'), !_Var2)))) {
            if ((long)track_step.num < 1) goto LAB_0021c87e;
            uVar3 = 0;
            while (((track_step.y[uVar3] != y || (0x18 < uVar3)) || (track_step.x[uVar3] != x))) {
              uVar3 = uVar3 + 1;
              if ((long)track_step.num == uVar3) {
                return false;
              }
            }
          }
        }
      }
    }
LAB_0021c8ab:
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool borg_happy_grid_bold(int y, int x)
{
    int i;

    borg_grid *ag = &borg_grids[y][x];

    /* Bounds Check */
    if (y >= DUNGEON_HGT - 2 || y <= 2 || x >= DUNGEON_WID - 2 || x <= 2)
        return false;

    /* Accept stairs */
    if (ag->feat == FEAT_LESS)
        return true;
    if (ag->feat == FEAT_MORE)
        return true;
    if (ag->glyph)
        return true;
    if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Hack -- weak/dark is very unhappy */
    if (borg.trait[BI_ISWEAK] || borg.trait[BI_LIGHT] == 0)
        return false;

    /* Apply a control effect so that he does not get stuck in a loop */
    if ((borg_t - borg_began) >= 2000)
        return false;

    /* Case 1a: north-south corridor */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1b: east-west corridor */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1aa: north-south doorway */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1ba: east-west doorway */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)) {
        /* Happy */
        return true;
    }

    /* Case 2a: north pillar */
    if (!borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y - 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2b: south pillar */
    if (!borg_cave_floor_bold(y + 1, x) && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y + 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2c: east pillar */
    if (!borg_cave_floor_bold(y, x + 1) && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y, x + 2)) {
        /* Happy */
        return true;
    }

    /* Case 2d: west pillar */
    if (!borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y, x - 2)) {
        /* Happy */
        return true;
    }

    /* check for grids that have been stepped on before */
    for (i = 0; i < track_step.num; i++) {
        /* Enqueue the grid */
        if ((track_step.y[i] == y) && (track_step.x[i] == x)) {
            /* Recent step is good */
            if (i < 25) {
                return true;
            }
        }
    }

    /* Not happy */
    return false;
}